

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.cpp
# Opt level: O3

ICallback * __thiscall Client::onConnected(Client *this,Client *client)

{
  usize *puVar1;
  Client *this_00;
  long lVar2;
  undefined1 *puVar3;
  char *pcVar4;
  ssize_t sVar5;
  undefined8 *puVar6;
  ICallback *pIVar7;
  usize postponed;
  String local_48;
  
  pcVar4 = String::operator_cast_to_char_((String *)(this + 0x30));
  Console::printf("Connected to %s:%d\n",pcVar4,(ulong)*(ushort *)(this + 0x58));
  if (this[0x5a] == (Client)0x1) {
    local_48.data = &local_48._data;
    local_48._data.ref = 0;
    local_48._data.str = "HTTP/1.1 200 OK\r\n\r\n";
    local_48._data.len = 0x13;
    this_00 = *(Client **)(this + 0x18);
    pcVar4 = String::operator_cast_to_char_(&local_48);
    sVar5 = Server::Client::write(this_00,(int)pcVar4,(void *)(local_48.data)->len,0);
    if ((local_48.data)->ref != 0) {
      LOCK();
      puVar1 = &(local_48.data)->ref;
      *puVar1 = *puVar1 - 1;
      UNLOCK();
      if ((*puVar1 == 0) && (local_48.data != (Data *)0x0)) {
        operator_delete__(local_48.data);
      }
    }
    if ((char)sVar5 != '\0') goto LAB_00104691;
LAB_001046ee:
    pIVar7 = (ICallback *)0x0;
  }
  else {
LAB_00104691:
    puVar6 = (undefined8 *)operator_new(0x18);
    *puVar6 = &PTR_onRead_0011ac90;
    puVar6[1] = client;
    puVar6[2] = this;
    *(undefined8 **)(this + 0x28) = puVar6;
    local_48.data = (Data *)0x0;
    lVar2 = *(long *)(this + 0x70);
    if (lVar2 != *(long *)(this + 0x78)) {
      sVar5 = Server::Client::write
                        (client,(int)lVar2,(void *)(*(long *)(this + 0x78) - lVar2),
                         (size_t)&local_48);
      if ((char)sVar5 == '\0') goto LAB_001046ee;
      puVar3 = *(undefined1 **)(this + 0x68);
      if (puVar3 == (undefined1 *)0x0) {
        *(undefined8 *)(this + 0x78) = *(undefined8 *)(this + 0x70);
      }
      else {
        *(undefined1 **)(this + 0x78) = puVar3;
        *(undefined1 **)(this + 0x70) = puVar3;
        *puVar3 = 0;
      }
    }
    if (local_48.data == (Data *)0x0) {
      Server::Client::resume(*(Client **)(this + 0x18));
    }
    pIVar7 = *(ICallback **)(this + 0x28);
  }
  return pIVar7;
}

Assistant:

Server::Client::ICallback *Client::onConnected(Server::Client &client)
{
    Console::printf("Connected to %s:%d\n", (const char*)_target, (int)_targetPort);
    if (_httpConnectMethod)
    {
        String response("HTTP/1.1 200 OK\r\n\r\n");
        if (!_client.write((const byte*)(const char*)response, response.length()))
            return nullptr;
    }
    _uplink = new Uplink(*this, client);
    usize postponed = 0;
    if (!_receiveBuffer.isEmpty())
    {
        if (!client.write(_receiveBuffer, _receiveBuffer.size(), &postponed))
            return nullptr;
        _receiveBuffer.clear();
    }
    if (!postponed)
        _client.resume();
    return _uplink;
}